

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O2

void server(void *arg)

{
  byte bVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  int aiStack_14c [59];
  undefined8 uStack_60;
  char *buf;
  int res [10];
  
  uStack_60 = 0x101608;
  iVar3 = nn_socket(1,0x51);
  if (iVar3 < 0) {
    uStack_60 = 0x1017da;
    nn_backtrace_print();
    pcVar7 = "sock >= 0";
    uStack_60 = 0x31;
  }
  else {
    uStack_60 = 0x101620;
    iVar4 = nn_bind(iVar3,"ipc://test-stress.ipc");
    if (iVar4 < 0) {
      uStack_60 = 0x101802;
      nn_backtrace_print();
      pcVar7 = "nn_bind(sock, SOCKET_ADDRESS) >= 0";
      uStack_60 = 0x32;
    }
    else {
      res[4] = 0;
      res[5] = 0;
      res[6] = 0;
      res[7] = 0;
      res[8] = 0;
      res[9] = 0;
      res[0] = 0;
      res[1] = 0;
      res[2] = 0;
      res[3] = 0;
      iVar4 = -100;
      while( true ) {
        if (iVar4 == 0) {
          uStack_60 = 0x1016c0;
          nn_close(iVar3);
          return;
        }
        buf = (char *)0x0;
        uStack_60 = 0x101660;
        uVar5 = nn_recv(iVar3,&buf,0xffffffffffffffff,0);
        if ((int)uVar5 < 0) break;
        if (uVar5 < 2) {
          uStack_60 = 0x101726;
          nn_backtrace_print();
          pcVar7 = "bytes >= 2";
          uStack_60 = 0x3c;
          goto LAB_001017bf;
        }
        bVar1 = *buf;
        if ((byte)(bVar1 + 0xa5) < 0xe6) {
          uStack_60 = 0x10174e;
          nn_backtrace_print();
          pcVar7 = "buf[0] >= \'A\' && buf[0] <= \'Z\'";
          uStack_60 = 0x3d;
          goto LAB_001017bf;
        }
        iVar6 = (int)buf[1];
        if (iVar6 < 0x61) {
          uStack_60 = 0x1016d0;
          nn_backtrace_print();
          pcVar7 = "buf[1] >= \'a\' && buf[0] <= \'z\'";
          uStack_60 = 0x3e;
          goto LAB_001017bf;
        }
        if (0x4a < bVar1) {
          uStack_60 = 0x101776;
          nn_backtrace_print();
          pcVar7 = "tid < THREAD_COUNT";
          uStack_60 = 0x41;
          goto LAB_001017bf;
        }
        if (aiStack_14c[bVar1] != iVar6 + -0x61) {
          uStack_60 = 0x10179e;
          nn_backtrace_print();
          pcVar7 = "res[tid] == num";
          uStack_60 = 0x42;
          goto LAB_001017bf;
        }
        aiStack_14c[bVar1] = iVar6 + -0x60;
        uStack_60 = 0x1016b5;
        nn_freemsg();
        iVar4 = iVar4 + 1;
      }
      uStack_60 = 0x1016fb;
      nn_backtrace_print();
      pcVar7 = "bytes >= 0";
      uStack_60 = 0x3b;
    }
  }
LAB_001017bf:
  uVar2 = uStack_60;
  uStack_60 = 0x1017c8;
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar7,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c",
          uVar2);
  uStack_60 = 0x1017d0;
  fflush(_stderr);
  uStack_60 = 0x1017d5;
  nn_err_abort();
}

Assistant:

static void server(NN_UNUSED void *arg)
{
    int bytes;
    int count;
    int sock = nn_socket(AF_SP, NN_PULL);
    int res[TEST_LOOPS];
    nn_assert(sock >= 0);
    nn_assert(nn_bind(sock, SOCKET_ADDRESS) >= 0);
    count = THREAD_COUNT * TEST_LOOPS;
    memset(res, 0, sizeof (res));
    while (count > 0)
    {
        char *buf = NULL;
        int tid;
        int num;
        bytes = nn_recv(sock, &buf, NN_MSG, 0);
        nn_assert(bytes >= 0);
        nn_assert(bytes >= 2);
        nn_assert(buf[0] >= 'A' && buf[0] <= 'Z');
        nn_assert(buf[1] >= 'a' && buf[0] <= 'z');
        tid = buf[0]-'A';
        num = buf[1]-'a';
        nn_assert(tid < THREAD_COUNT);
        nn_assert(res[tid] == num);
        res[tid]=num+1;
        nn_freemsg(buf);
        count--;
    }
    nn_close(sock);
}